

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O3

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  ostream *poVar1;
  string component_test;
  string local_30;
  
  CreateComponentTest_abi_cxx11_
            (&local_30,(cmInstallGenerator *)os,(this->Component)._M_dataplus._M_p,
             this->ExcludeFromAll);
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])(this,os,2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n\n",9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str(), this->ExcludeFromAll);
  os << indent << "if(" << component_test << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}